

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Deconvolution_x86::forward(Deconvolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  _func_int **pp_Var8;
  void *pvVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  Layer *pLVar14;
  _func_int **pp_Var15;
  _func_int **pp_Var16;
  _func_int *p_Var17;
  int *piVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  void *pvVar29;
  Mat *pMVar30;
  uint uVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  undefined4 *__s;
  undefined4 *puVar36;
  long lVar37;
  _func_int *p_Var38;
  byte bVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  uint uVar43;
  int iVar44;
  ulong uVar45;
  long lVar46;
  ulong uVar47;
  int y;
  int w_1;
  int iVar48;
  int iVar49;
  float *pfVar50;
  int iVar51;
  ulong uVar52;
  ulong uVar53;
  void *pvVar54;
  float *pfVar55;
  int i;
  undefined1 (*pauVar56) [16];
  ulong uVar57;
  int iVar58;
  uint uVar59;
  long lVar60;
  long lVar61;
  int y_2;
  int w;
  void *pvVar62;
  ulong uVar63;
  undefined1 auVar64 [16];
  undefined1 extraout_var [12];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar69;
  v4sf one;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar70;
  float fVar82;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [12];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined4 uVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar94;
  float fVar101;
  float fVar103;
  float fVar104;
  undefined1 auVar96 [16];
  float fVar95;
  float fVar102;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  int h_1;
  int size;
  int outh_1;
  int h;
  int outh;
  int outw;
  Option opt_b;
  void *local_280;
  int local_278;
  long local_268;
  long local_240;
  float *local_220;
  byte local_218;
  undefined1 local_1f8 [16];
  Mat local_1a8;
  undefined1 local_158 [16];
  Option *local_140;
  ulong local_138;
  long local_130;
  Mat *local_128;
  int local_11c;
  _func_int **local_118;
  void *local_110;
  int *local_108;
  size_t local_100;
  int local_f8;
  Allocator *local_f0;
  undefined4 local_e8;
  int iStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  int local_d8;
  size_t local_d0;
  void *local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  long *local_a8;
  undefined4 uStack_a0;
  int iStack_9c;
  undefined4 uStack_98;
  undefined8 uStack_94;
  undefined8 local_88;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar5 = bottom_blob->w;
  iVar6 = bottom_blob->h;
  p_Var38 = this->_vptr_Deconvolution_x86[-3];
  iVar41 = *(int *)(&this->field_0xdc + (long)p_Var38);
  iVar42 = *(int *)(&this->field_0xe4 + (long)p_Var38);
  iVar40 = (*(int *)(&this->field_0xd8 + (long)p_Var38) + -1) *
           *(int *)(&this->field_0xe0 + (long)p_Var38);
  local_130 = CONCAT44(local_130._4_4_,iVar40);
  iVar44 = *(int *)(&this->field_0xe8 + (long)p_Var38);
  iVar49 = *(int *)(&this->field_0xd4 + (long)p_Var38);
  iVar51 = *(int *)(&this->field_0xfc + (long)p_Var38);
  iVar58 = *(int *)(&this->field_0x100 + (long)p_Var38);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = local_1f8._0_8_;
  local_1f8 = auVar68 << 0x40;
  bVar39 = (*(uint *)(&this->field_0xd0 + (long)p_Var38) & 3) == 0 & opt->use_packing_layout;
  uVar45 = bottom_blob->elemsize;
  local_138 = (ulong)bottom_blob->elempack;
  iVar48 = (uint)bVar39 + (uint)bVar39 * 2 + 1;
  uVar31 = (int)*(uint *)(&this->field_0xd0 + (long)p_Var38) / iVar48;
  local_1a8.cstep = 0;
  local_1a8.data = (void *)0x0;
  local_1a8.refcount._0_4_ = 0;
  local_1a8.refcount._4_4_ = 0;
  local_1a8.elemsize._0_4_ = 0;
  local_1a8.elemsize._4_4_ = 0;
  local_1a8.elempack = 0;
  local_1a8.allocator = (Allocator *)0x0;
  local_1a8.dims = 0;
  local_1a8.w = 0;
  local_1a8.h = 0;
  local_1a8.d = 0;
  local_1a8.c = 0;
  p_Var38 = this->_vptr_Deconvolution_x86[-3];
  lVar60 = 0x10;
  if ((((((*(int *)(&this->field_0xec + (long)p_Var38) < 1) &&
         (*(int *)(&this->field_0xf0 + (long)p_Var38) < 1)) &&
        (*(int *)(&this->field_0xf4 + (long)p_Var38) < 1)) &&
       (*(int *)(&this->field_0xf8 + (long)p_Var38) < 1)) &&
      ((*(int *)(&this->field_0x104 + (long)p_Var38) < 1 ||
       (*(int *)(&this->field_0x108 + (long)p_Var38) < 1)))) && (lVar60 = 8, &local_1a8 != top_blob)
     ) {
    piVar18 = top_blob->refcount;
    if (piVar18 != (int *)0x0) {
      LOCK();
      *piVar18 = *piVar18 + 1;
      UNLOCK();
    }
    lVar60 = 8;
    local_1a8.data = top_blob->data;
    local_1a8.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_1a8.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_1a8.elemsize._0_4_ = (undefined4)top_blob->elemsize;
    local_1a8.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
    local_1a8.elempack = top_blob->elempack;
    local_1a8.allocator = top_blob->allocator;
    uVar25 = top_blob->dims;
    uVar26 = top_blob->w;
    uVar27 = top_blob->h;
    uVar28 = top_blob->d;
    local_1a8.c = top_blob->c;
    local_1a8.cstep = top_blob->cstep;
    local_1a8.dims = uVar25;
    local_1a8.w = uVar26;
    local_1a8.h = uVar27;
    local_1a8.d = uVar28;
  }
  iVar41 = (iVar49 + -1) * iVar41;
  iVar51 = iVar51 + (iVar5 + -1) * iVar42 + iVar41 + 1;
  local_140 = opt;
  local_128 = top_blob;
  Mat::create(&local_1a8,iVar51,iVar58 + 1 + (iVar6 + -1) * iVar44 + iVar40,uVar31,
              uVar45 / local_138 << bVar39 * '\x02',iVar48,*(Allocator **)(&opt->lightmode + lVar60)
             );
  iVar44 = local_1a8.h;
  iVar42 = local_1a8.w;
  pvVar29 = local_1a8.data;
  auVar65 = _DAT_00565660;
  auVar87 = _DAT_00565630;
  auVar68 = _DAT_00565620;
  iVar49 = -100;
  if ((local_1a8.data == (void *)0x0) || (local_1a8.cstep * (long)local_1a8.c == 0))
  goto LAB_00283f80;
  pp_Var8 = this->_vptr_Deconvolution_x86;
  p_Var38 = pp_Var8[-3];
  uVar43 = *(uint *)(&this->field_0xd4 + (long)p_Var38);
  uVar7 = *(uint *)(&this->field_0xd8 + (long)p_Var38);
  iVar49 = uVar7 * uVar43;
  if (local_140->use_sgemm_convolution == true) {
    local_110 = bottom_blob->data;
    local_108 = bottom_blob->refcount;
    local_100 = bottom_blob->elemsize;
    local_f8 = bottom_blob->elempack;
    local_f0 = bottom_blob->allocator;
    uVar23 = bottom_blob->dims;
    uVar24 = bottom_blob->d;
    iVar41 = bottom_blob->w;
    iVar42 = bottom_blob->h;
    local_d8 = bottom_blob->c;
    local_d0 = bottom_blob->cstep;
    if (local_108 != (int *)0x0) {
      LOCK();
      *local_108 = *local_108 + 1;
      UNLOCK();
      iVar41 = bottom_blob->w;
      iVar42 = bottom_blob->h;
    }
    _local_e8 = CONCAT44(iVar42 * iVar41,uVar23);
    _uStack_e0 = CONCAT44(uVar24,1);
    local_88 = 0;
    local_c8 = (void *)0x0;
    uStack_c0 = 0;
    uStack_bc = 0;
    local_b8 = 0;
    uStack_b4 = 0;
    uStack_b0 = 0;
    local_a8 = (long *)0x0;
    uStack_a0 = 0;
    iStack_9c = 0;
    uStack_98 = 0;
    uStack_94 = 0;
    local_78._0_1_ = local_140->lightmode;
    local_78._1_3_ = *(undefined3 *)&local_140->field_0x1;
    local_78._4_4_ = local_140->num_threads;
    local_68 = local_140->workspace_allocator;
    uStack_60._0_4_ = local_140->openmp_blocktime;
    uStack_60._4_1_ = local_140->use_winograd_convolution;
    uStack_60._5_1_ = local_140->use_sgemm_convolution;
    uStack_60._6_1_ = local_140->use_int8_inference;
    uStack_60._7_1_ = local_140->use_vulkan_compute;
    local_58._0_1_ = local_140->use_bf16_storage;
    local_58._1_1_ = local_140->use_fp16_packed;
    local_58._2_1_ = local_140->use_fp16_storage;
    local_58._3_1_ = local_140->use_fp16_arithmetic;
    local_58._4_1_ = local_140->use_int8_packed;
    local_58._5_1_ = local_140->use_int8_storage;
    local_58._6_1_ = local_140->use_int8_arithmetic;
    local_58._7_1_ = local_140->use_packing_layout;
    uStack_50._0_1_ = local_140->use_shader_pack8;
    uStack_50._1_1_ = local_140->use_subgroup_basic;
    uStack_50._2_1_ = local_140->use_subgroup_vote;
    uStack_50._3_1_ = local_140->use_subgroup_ballot;
    uStack_50._4_1_ = local_140->use_subgroup_shuffle;
    uStack_50._5_1_ = local_140->use_image_storage;
    uStack_50._6_1_ = local_140->use_tensor_storage;
    uStack_50._7_1_ = local_140->use_reserved_0;
    local_48._0_4_ = local_140->flush_denormals;
    local_48._4_1_ = local_140->use_local_pool_allocator;
    local_48._5_1_ = local_140->use_shader_local_memory;
    local_48._6_1_ = local_140->use_cooperative_matrix;
    local_48._7_1_ = local_140->use_winograd23_convolution;
    uStack_40._0_1_ = local_140->use_winograd43_convolution;
    uStack_40._1_1_ = local_140->use_winograd63_convolution;
    uStack_40._2_1_ = local_140->use_a53_a55_optimized_kernel;
    uStack_40._3_1_ = local_140->use_reserved_7;
    uStack_40._4_1_ = local_140->use_reserved_8;
    uStack_40._5_1_ = local_140->use_reserved_9;
    uStack_40._6_1_ = local_140->use_reserved_10;
    uStack_40._7_1_ = local_140->use_reserved_11;
    pAStack_70 = local_1a8.allocator;
    (*this->gemm->_vptr_Layer[7])();
    auVar65 = _DAT_00567bc0;
    auVar87 = _DAT_00562020;
    auVar68 = _DAT_00562010;
    pp_Var8 = this->_vptr_Deconvolution_x86;
    p_Var38 = pp_Var8[-3];
    iVar41 = iVar51 * *(int *)(&this->field_0xe8 + (long)p_Var38) -
             *(int *)(&this->field_0xe4 + (long)p_Var38) * iVar5 << bVar39 * '\x02';
    if (bVar39 == 0) {
      if (0 < (int)uVar31) {
        uVar45 = CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize);
        lVar60 = (long)local_1a8.h * (long)local_1a8.w;
        uVar63 = 0;
        iVar42 = (int)((uVar45 * lVar60 + 0xf & 0xfffffffffffffff0) / uVar45);
        if (local_1a8.dims == 4) {
          iVar42 = (int)lVar60;
        }
        uVar43 = iVar42 * local_1a8.d;
        lVar60 = (ulong)uVar43 - 1;
        auVar64._8_4_ = (int)lVar60;
        auVar64._0_8_ = lVar60;
        auVar64._12_4_ = (int)((ulong)lVar60 >> 0x20);
        local_158._0_8_ = local_1a8.data;
        lVar60 = (long)local_1a8.data + 0xc;
        auVar64 = auVar64 ^ _DAT_00562020;
        do {
          uVar88 = 0;
          if ((*(long *)(&this->field_0x1a8 + (long)p_Var38) != 0) &&
             ((long)*(int *)(&this->field_0x1e0 + (long)p_Var38) *
              *(long *)(&this->field_0x1e8 + (long)p_Var38) != 0)) {
            uVar88 = *(undefined4 *)(*(long *)(&this->field_0x1a8 + (long)p_Var38) + uVar63 * 4);
          }
          if (0 < (int)uVar43) {
            uVar52 = 0;
            do {
              auVar93._8_4_ = (int)uVar52;
              auVar93._0_8_ = uVar52;
              auVar93._12_4_ = (int)(uVar52 >> 0x20);
              auVar100 = (auVar93 | auVar68) ^ auVar87;
              iVar42 = auVar64._4_4_;
              if ((bool)(~(iVar42 < auVar100._4_4_ ||
                          auVar64._0_4_ < auVar100._0_4_ && auVar100._4_4_ == iVar42) & 1)) {
                *(undefined4 *)(lVar60 + -0xc + uVar52 * 4) = uVar88;
              }
              if (auVar100._12_4_ <= auVar64._12_4_ &&
                  (auVar100._8_4_ <= auVar64._8_4_ || auVar100._12_4_ != auVar64._12_4_)) {
                *(undefined4 *)(lVar60 + -8 + uVar52 * 4) = uVar88;
              }
              auVar100 = (auVar93 | auVar65) ^ auVar87;
              iVar44 = auVar100._4_4_;
              if (iVar44 <= iVar42 && (iVar44 != iVar42 || auVar100._0_4_ <= auVar64._0_4_)) {
                *(undefined4 *)(lVar60 + -4 + uVar52 * 4) = uVar88;
                *(undefined4 *)(lVar60 + uVar52 * 4) = uVar88;
              }
              uVar52 = uVar52 + 4;
            } while ((uVar43 + 3 & 0xfffffffc) != uVar52);
            p_Var38 = pp_Var8[-3];
          }
          if (0 < *(int *)(&this->field_0xd8 + (long)p_Var38)) {
            pfVar50 = (float *)(uVar63 * (long)iVar49 *
                                         (long)iStack_9c * CONCAT44(uStack_b4,local_b8) +
                               (long)local_c8);
            iVar42 = 0;
            do {
              if (0 < *(int *)(&this->field_0xd4 + (long)p_Var38)) {
                iVar44 = 0;
                do {
                  if (0 < iVar6) {
                    pfVar55 = (float *)((long)local_1a8.data +
                                       (long)iVar44 *
                                       (long)*(int *)(&this->field_0xdc + (long)p_Var38) * 4 +
                                       (long)iVar42 *
                                       (long)*(int *)(&this->field_0xe0 + (long)p_Var38) *
                                       uVar45 * (long)local_1a8.w +
                                       local_1a8.cstep * uVar45 * uVar63);
                    iVar51 = 0;
                    do {
                      iVar58 = iVar5;
                      if (0 < iVar5) {
                        do {
                          *pfVar55 = *pfVar55 + *pfVar50;
                          p_Var38 = pp_Var8[-3];
                          pfVar55 = pfVar55 + *(int *)(&this->field_0xe4 + (long)p_Var38);
                          pfVar50 = pfVar50 + 1;
                          iVar58 = iVar58 + -1;
                        } while (iVar58 != 0);
                      }
                      pfVar55 = pfVar55 + iVar41;
                      iVar51 = iVar51 + 1;
                    } while (iVar51 != iVar6);
                  }
                  iVar44 = iVar44 + 1;
                } while (iVar44 < *(int *)(&this->field_0xd4 + (long)p_Var38));
              }
              iVar42 = iVar42 + 1;
            } while (iVar42 < *(int *)(&this->field_0xd8 + (long)p_Var38));
          }
          uVar63 = uVar63 + 1;
          lVar60 = lVar60 + local_1a8.cstep * uVar45;
        } while (uVar63 != uVar31);
      }
    }
    else if (0 < (int)uVar31) {
      uVar45 = 0;
      do {
        pfVar50 = (float *)((long)iStack_9c * uVar45 * (long)iVar49 * CONCAT44(uStack_b4,local_b8) +
                           (long)local_c8);
        lVar60 = (long)local_1a8.w;
        uVar63 = CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize);
        __s = (undefined4 *)(local_1a8.cstep * uVar45 * uVar63 + (long)local_1a8.data);
        uVar53 = local_1a8.h * lVar60;
        uVar52 = (uVar63 * uVar53 + 0xf & 0xfffffffffffffff0) / uVar63;
        if (local_1a8.dims == 4) {
          uVar52 = uVar53;
        }
        if ((*(long *)(&this->field_0x1a8 + (long)p_Var38) == 0) ||
           ((long)*(int *)(&this->field_0x1e0 + (long)p_Var38) *
            *(long *)(&this->field_0x1e8 + (long)p_Var38) == 0)) {
          uVar43 = local_1a8.d * (int)uVar52;
          if (0 < (int)uVar43) {
            memset(__s,0,(ulong)uVar43 << 4);
          }
        }
        else {
          iVar42 = local_1a8.d * (int)uVar52;
          if (0 < iVar42) {
            puVar36 = (undefined4 *)(*(long *)(&this->field_0x1a8 + (long)p_Var38) + uVar45 * 0x10);
            uVar88 = *puVar36;
            uVar3 = puVar36[1];
            uVar4 = puVar36[2];
            uVar22 = puVar36[3];
            puVar36 = __s;
            do {
              *puVar36 = uVar88;
              puVar36[1] = uVar3;
              puVar36[2] = uVar4;
              puVar36[3] = uVar22;
              puVar36 = puVar36 + 4;
              iVar42 = iVar42 + -1;
            } while (iVar42 != 0);
          }
        }
        p_Var38 = pp_Var8[-3];
        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var38)) {
          iVar42 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)p_Var38)) {
              iVar44 = 0;
              do {
                if (0 < iVar6) {
                  pfVar55 = (float *)((long)__s +
                                     (long)(*(int *)(&this->field_0xdc + (long)p_Var38) * iVar44 * 4
                                           ) * 4 +
                                     (long)*(int *)(&this->field_0xe0 + (long)p_Var38) *
                                     (long)iVar42 * uVar63 * lVar60);
                  iVar51 = 0;
                  do {
                    iVar58 = iVar5;
                    if (0 < iVar5) {
                      do {
                        fVar66 = pfVar50[1];
                        auVar100._0_4_ = pfVar50[2];
                        fVar69 = pfVar50[3];
                        *pfVar55 = *pfVar50 + *pfVar55;
                        pfVar55[1] = fVar66 + pfVar55[1];
                        pfVar55[2] = auVar100._0_4_ + pfVar55[2];
                        pfVar55[3] = fVar69 + pfVar55[3];
                        p_Var38 = pp_Var8[-3];
                        pfVar55 = pfVar55 + (long)*(int *)(&this->field_0xe4 + (long)p_Var38) * 4;
                        pfVar50 = pfVar50 + 4;
                        iVar58 = iVar58 + -1;
                      } while (iVar58 != 0);
                    }
                    pfVar55 = pfVar55 + iVar41;
                    iVar51 = iVar51 + 1;
                  } while (iVar51 != iVar6);
                }
                iVar44 = iVar44 + 1;
              } while (iVar44 < *(int *)(&this->field_0xd4 + (long)p_Var38));
            }
            iVar42 = iVar42 + 1;
          } while (iVar42 < *(int *)(&this->field_0xd8 + (long)p_Var38));
        }
        uVar45 = uVar45 + 1;
      } while (uVar45 != uVar31);
    }
    pLVar14 = this->activation;
    if (pLVar14 != (Layer *)0x0) {
      (*pLVar14->_vptr_Layer[9])(pLVar14,&local_1a8,local_140);
    }
    piVar18 = (int *)CONCAT44(uStack_bc,uStack_c0);
    if (piVar18 != (int *)0x0) {
      LOCK();
      *piVar18 = *piVar18 + -1;
      UNLOCK();
      if (*piVar18 == 0) {
        if (local_a8 == (long *)0x0) {
          if (local_c8 != (void *)0x0) {
            free(local_c8);
          }
        }
        else {
          (**(code **)(*local_a8 + 0x18))();
        }
      }
    }
    if (local_108 != (int *)0x0) {
      LOCK();
      *local_108 = *local_108 + -1;
      UNLOCK();
      if (*local_108 == 0) {
        if (local_f0 == (Allocator *)0x0) {
          if (local_110 != (void *)0x0) {
            free(local_110);
          }
        }
        else {
          (*local_f0->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    local_218 = bVar39 ^ 1;
    local_11c = iVar49;
    local_118 = pp_Var8;
    if ((int)local_138 == 4 && bVar39 == 1) {
      if (local_1a8.c < 1) goto LAB_00283f39;
      iVar5 = *(int *)(&this->field_0xdc + (long)p_Var38);
      iVar6 = *(int *)(&this->field_0xe0 + (long)p_Var38);
      local_1f8._0_4_ = iVar6;
      iVar51 = *(int *)(&this->field_0xe4 + (long)p_Var38);
      iVar58 = *(int *)(&this->field_0xe8 + (long)p_Var38);
      uVar88 = *(undefined4 *)(&this->field_0x114 + (long)p_Var38);
      lVar60 = *(long *)(&this->field_0x1a8 + (long)p_Var38);
      local_268 = 0;
      fVar66 = (float)DAT_00565660;
      auVar100._0_4_ = DAT_00565660._4_4_;
      fVar69 = DAT_00565660._8_4_;
      do {
        if (0 < local_1a8.h) {
          iVar40 = bottom_blob->w;
          iVar48 = bottom_blob->h;
          pauVar56 = (undefined1 (*) [16])
                     (local_1a8.cstep * local_268 *
                      CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize) +
                     (long)local_1a8.data);
          uVar31 = bottom_blob->c;
          local_278 = 0;
          do {
            if (0 < local_1a8.w) {
              uVar59 = 0;
              iVar35 = (1 - uVar43) * iVar5;
              do {
                auVar76 = ZEXT816(0);
                if (lVar60 == 0) {
                  auVar89 = ZEXT816(0);
                }
                else {
                  auVar89 = *(undefined1 (*) [16])(lVar60 + local_268 * 0x10);
                }
                if (0 < (int)uVar31) {
                  pvVar62 = (void *)((this->weight_data_tm).cstep * local_268 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar9 = bottom_blob->data;
                  lVar46 = (long)bottom_blob->w * bottom_blob->elemsize;
                  local_158._0_8_ = lVar46;
                  uVar45 = 0;
                  do {
                    if (0 < (int)uVar7) {
                      uVar52 = 0;
                      uVar63 = 0;
                      do {
                        iVar32 = (((int)uVar63 - uVar7) + 1) * iVar6 + local_278;
                        if ((((-1 < iVar32) && (iVar33 = iVar32 / iVar58, iVar32 % iVar58 == 0)) &&
                            (0 < (int)uVar43)) && (iVar33 < iVar48)) {
                          lVar61 = iVar33 * lVar46 +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar45;
                          uVar53 = (ulong)uVar43;
                          uVar57 = uVar52;
                          iVar32 = iVar35;
                          do {
                            if (((-1 < iVar32) && (iVar33 = iVar32 / iVar51, iVar32 % iVar51 == 0))
                               && (iVar33 < iVar40)) {
                              lVar37 = (long)(iVar33 << 2);
                              fVar109 = *(float *)((long)pvVar9 + lVar37 * 4 + lVar61);
                              fVar70 = *(float *)((long)pvVar9 + lVar37 * 4 + lVar61 + 4);
                              uVar47 = uVar57 & 0xffffffff;
                              pfVar50 = (float *)((long)pvVar62 + uVar47 * 4);
                              fVar95 = *(float *)((long)pvVar9 + lVar37 * 4 + lVar61 + 8);
                              fVar102 = auVar89._4_4_;
                              fVar105 = auVar89._8_4_;
                              fVar106 = auVar89._12_4_;
                              fVar82 = *(float *)((long)pvVar9 + lVar37 * 4 + lVar61 + 0xc);
                              pfVar55 = (float *)((long)pvVar62 + uVar47 * 4 + 0x10);
                              pfVar1 = (float *)((long)pvVar62 + uVar47 * 4 + 0x20);
                              pfVar2 = (float *)((long)pvVar62 + uVar47 * 4 + 0x30);
                              auVar89._0_4_ =
                                   fVar82 * *pfVar2 +
                                   fVar95 * *pfVar1 + fVar70 * *pfVar55 +
                                   fVar109 * *pfVar50 + auVar89._0_4_;
                              auVar89._4_4_ =
                                   fVar82 * pfVar2[1] +
                                   fVar95 * pfVar1[1] + fVar70 * pfVar55[1] +
                                   fVar109 * pfVar50[1] + fVar102;
                              auVar89._8_4_ =
                                   fVar82 * pfVar2[2] +
                                   fVar95 * pfVar1[2] + fVar70 * pfVar55[2] +
                                   fVar109 * pfVar50[2] + fVar105;
                              auVar89._12_4_ =
                                   fVar82 * pfVar2[3] +
                                   fVar95 * pfVar1[3] + fVar70 * pfVar55[3] +
                                   fVar109 * pfVar50[3] + fVar106;
                            }
                            uVar57 = uVar57 + 0x10;
                            iVar32 = iVar32 + iVar5;
                            uVar53 = uVar53 - 1;
                          } while (uVar53 != 0);
                        }
                        uVar63 = uVar63 + 1;
                        uVar52 = uVar52 + (ulong)uVar43 * 0x10;
                      } while (uVar63 != uVar7);
                    }
                    pvVar62 = (void *)((long)pvVar62 + (long)(int)(uVar43 * uVar7 * 0x10) * 4);
                    uVar45 = uVar45 + 1;
                  } while (uVar45 != uVar31);
                }
                fVar70 = auVar89._0_4_;
                fVar95 = auVar89._4_4_;
                fVar82 = auVar89._8_4_;
                fVar102 = auVar89._12_4_;
                fVar109 = auVar65._12_4_;
                switch(uVar88) {
                case 1:
                  auVar89 = maxps(auVar89,auVar76);
                  break;
                case 2:
                  auVar75 = maxps(auVar89,auVar76);
                  auVar76 = minps(auVar89,auVar76);
                  fVar109 = **(float **)(&this->field_0x118 + (long)p_Var38);
                  auVar89._4_4_ = fVar109 * auVar76._4_4_ + auVar75._4_4_;
                  auVar89._0_4_ = fVar109 * auVar76._0_4_ + auVar75._0_4_;
                  auVar89._8_4_ = fVar109 * auVar76._8_4_ + auVar75._8_4_;
                  auVar89._12_4_ = fVar109 * auVar76._12_4_ + auVar75._12_4_;
                  break;
                case 3:
                  uVar3 = **(undefined4 **)(&this->field_0x118 + (long)p_Var38);
                  uVar4 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var38))[1];
                  auVar73._4_4_ = uVar3;
                  auVar73._0_4_ = uVar3;
                  auVar73._8_4_ = uVar3;
                  auVar73._12_4_ = uVar3;
                  auVar96._4_4_ = uVar4;
                  auVar96._0_4_ = uVar4;
                  auVar96._8_4_ = uVar4;
                  auVar96._12_4_ = uVar4;
                  auVar76 = maxps(auVar89,auVar73);
                  auVar89 = minps(auVar76,auVar96);
                  break;
                case 4:
                  auVar90._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
                  auVar90._8_4_ = -fVar82;
                  auVar90._12_4_ = -fVar102;
                  auVar76 = minps(auVar90,auVar68);
                  auVar76 = maxps(auVar76,auVar87);
                  fVar95 = auVar76._0_4_ * 1.442695 + 0.5;
                  fVar102 = auVar76._4_4_ * 1.442695 + 0.5;
                  fVar106 = auVar76._8_4_ * 1.442695 + 0.5;
                  fVar108 = auVar76._12_4_ * 1.442695 + 0.5;
                  fVar70 = (float)(int)fVar95;
                  fVar82 = (float)(int)fVar102;
                  fVar105 = (float)(int)fVar106;
                  fVar107 = (float)(int)fVar108;
                  fVar70 = fVar70 - (float)(-(uint)(fVar95 < fVar70) & (uint)fVar66);
                  fVar82 = fVar82 - (float)(-(uint)(fVar102 < fVar82) & (uint)auVar100._0_4_);
                  fVar105 = fVar105 - (float)(-(uint)(fVar106 < fVar105) & (uint)fVar69);
                  fVar107 = fVar107 - (float)(-(uint)(fVar108 < fVar107) & (uint)fVar109);
                  fVar95 = fVar70 * -0.6931472 + auVar76._0_4_;
                  fVar102 = fVar82 * -0.6931472 + auVar76._4_4_;
                  fVar106 = fVar105 * -0.6931472 + auVar76._8_4_;
                  fVar108 = fVar107 * -0.6931472 + auVar76._12_4_;
                  auVar74._0_4_ =
                       fVar95 + fVar66 +
                       (((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 + 0.008333452) * fVar95
                         + 0.041665796) * fVar95 + 0.16666666) * fVar95 + 0.5) * fVar95 * fVar95;
                  auVar74._4_4_ =
                       fVar102 + auVar100._0_4_ +
                       (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) *
                          fVar102 + 0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5) *
                       fVar102 * fVar102;
                  auVar74._8_4_ =
                       fVar106 + fVar69 +
                       (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) *
                          fVar106 + 0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5) *
                       fVar106 * fVar106;
                  auVar74._12_4_ =
                       fVar108 + fVar109 +
                       (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) *
                          fVar108 + 0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5) *
                       fVar108 * fVar108;
                  auVar97._0_4_ =
                       (float)((int)fVar70 * 0x800000 + (int)fVar66) * auVar74._0_4_ + fVar66;
                  auVar97._4_4_ =
                       (float)((int)fVar82 * 0x800000 + (int)auVar100._0_4_) * auVar74._4_4_ +
                       auVar100._0_4_;
                  auVar97._8_4_ =
                       (float)((int)fVar105 * 0x800000 + (int)fVar69) * auVar74._8_4_ + fVar69;
                  auVar97._12_4_ =
                       (float)((int)fVar107 * 0x800000 + (int)fVar109) * auVar74._12_4_ + fVar109;
                  auVar76 = rcpps(auVar74,auVar97);
                  fVar70 = auVar76._0_4_;
                  fVar95 = auVar76._4_4_;
                  fVar82 = auVar76._8_4_;
                  fVar102 = auVar76._12_4_;
                  auVar89._0_4_ = (fVar66 - auVar97._0_4_ * fVar70) * fVar70 + fVar70;
                  auVar89._4_4_ = (auVar100._0_4_ - auVar97._4_4_ * fVar95) * fVar95 + fVar95;
                  auVar89._8_4_ = (fVar69 - auVar97._8_4_ * fVar82) * fVar82 + fVar82;
                  auVar89._12_4_ = (fVar109 - auVar97._12_4_ * fVar102) * fVar102 + fVar102;
                  break;
                case 5:
                  auVar76 = minps(auVar89,auVar68);
                  auVar76 = maxps(auVar76,auVar87);
                  fVar105 = auVar76._0_4_ * 1.442695 + 0.5;
                  fVar106 = auVar76._4_4_ * 1.442695 + 0.5;
                  fVar107 = auVar76._8_4_ * 1.442695 + 0.5;
                  fVar108 = auVar76._12_4_ * 1.442695 + 0.5;
                  fVar94 = (float)(int)fVar105;
                  fVar101 = (float)(int)fVar106;
                  fVar103 = (float)(int)fVar107;
                  fVar104 = (float)(int)fVar108;
                  fVar94 = fVar94 - (float)(-(uint)(fVar105 < fVar94) & (uint)fVar66);
                  fVar101 = fVar101 - (float)(-(uint)(fVar106 < fVar101) & (uint)auVar100._0_4_);
                  fVar103 = fVar103 - (float)(-(uint)(fVar107 < fVar103) & (uint)fVar69);
                  fVar104 = fVar104 - (float)(-(uint)(fVar108 < fVar104) & (uint)fVar109);
                  fVar105 = auVar76._0_4_ - fVar94 * 0.6931472;
                  fVar106 = auVar76._4_4_ - fVar101 * 0.6931472;
                  fVar107 = auVar76._8_4_ - fVar103 * 0.6931472;
                  fVar108 = auVar76._12_4_ - fVar104 * 0.6931472;
                  auVar110._0_4_ =
                       (float)((int)fVar94 * 0x800000 + (int)fVar66) *
                       (fVar105 + fVar66 +
                       (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) *
                          fVar105 + 0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5) *
                       fVar105 * fVar105) + fVar66;
                  auVar110._4_4_ =
                       (float)((int)fVar101 * 0x800000 + (int)auVar100._0_4_) *
                       (fVar106 + auVar100._0_4_ +
                       (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) *
                          fVar106 + 0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5) *
                       fVar106 * fVar106) + auVar100._0_4_;
                  auVar110._8_4_ =
                       (float)((int)fVar103 * 0x800000 + (int)fVar69) *
                       (fVar107 + fVar69 +
                       (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) *
                          fVar107 + 0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) *
                       fVar107 * fVar107) + fVar69;
                  auVar110._12_4_ =
                       (float)((int)fVar104 * 0x800000 + (int)fVar109) *
                       (fVar108 + fVar109 +
                       (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) *
                          fVar108 + 0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5) *
                       fVar108 * fVar108) + fVar109;
                  auVar76 = maxps(auVar110,_DAT_005656d0);
                  fVar105 = (float)(auVar76._0_4_ & 0x807fffff | 0x3f000000);
                  fVar107 = (float)(auVar76._4_4_ & 0x807fffff | 0x3f000000);
                  fVar94 = (float)(auVar76._8_4_ & 0x807fffff | 0x3f000000);
                  fVar103 = (float)(auVar76._12_4_ & 0x807fffff | 0x3f000000);
                  fVar106 = fVar105 + -1.0 + (float)(-(uint)(fVar105 < 0.70710677) & (uint)fVar105);
                  fVar108 = fVar107 + -1.0 + (float)(-(uint)(fVar107 < 0.70710677) & (uint)fVar107);
                  fVar101 = fVar94 + -1.0 + (float)(-(uint)(fVar94 < 0.70710677) & (uint)fVar94);
                  fVar104 = fVar103 + -1.0 + (float)(-(uint)(fVar103 < 0.70710677) & (uint)fVar103);
                  auVar83._0_4_ =
                       ~-(uint)(auVar110._0_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar76._0_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar105 < 0.70710677) & (uint)fVar66)) * 0.6931472 +
                               fVar106 +
                              (((((((((fVar106 * 0.070376836 + -0.1151461) * fVar106 + 0.116769984)
                                     * fVar106 + -0.12420141) * fVar106 + 0.14249323) * fVar106 +
                                  -0.16668057) * fVar106 + 0.20000714) * fVar106 + -0.24999994) *
                                fVar106 + 0.3333333) * fVar106 + -0.5) * fVar106 * fVar106) * -2.0);
                  auVar83._4_4_ =
                       ~-(uint)(auVar110._4_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar76._4_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar107 < 0.70710677) & (uint)auVar100._0_4_)) *
                               0.6931472 + fVar108 +
                              (((((((((fVar108 * 0.070376836 + -0.1151461) * fVar108 + 0.116769984)
                                     * fVar108 + -0.12420141) * fVar108 + 0.14249323) * fVar108 +
                                  -0.16668057) * fVar108 + 0.20000714) * fVar108 + -0.24999994) *
                                fVar108 + 0.3333333) * fVar108 + -0.5) * fVar108 * fVar108) * -2.0);
                  auVar83._8_4_ =
                       ~-(uint)(auVar110._8_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar76._8_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar94 < 0.70710677) & (uint)fVar69)) * 0.6931472 +
                               fVar101 +
                              (((((((((fVar101 * 0.070376836 + -0.1151461) * fVar101 + 0.116769984)
                                     * fVar101 + -0.12420141) * fVar101 + 0.14249323) * fVar101 +
                                  -0.16668057) * fVar101 + 0.20000714) * fVar101 + -0.24999994) *
                                fVar101 + 0.3333333) * fVar101 + -0.5) * fVar101 * fVar101) * -2.0);
                  auVar83._12_4_ =
                       ~-(uint)(auVar110._12_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar76._12_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar103 < 0.70710677) & (uint)fVar109)) * 0.6931472 +
                               fVar104 +
                              (((((((((fVar104 * 0.070376836 + -0.1151461) * fVar104 + 0.116769984)
                                     * fVar104 + -0.12420141) * fVar104 + 0.14249323) * fVar104 +
                                  -0.16668057) * fVar104 + 0.20000714) * fVar104 + -0.24999994) *
                                fVar104 + 0.3333333) * fVar104 + -0.5) * fVar104 * fVar104) * -2.0);
                  auVar71._0_8_ =
                       CONCAT44(-(uint)(auVar110._4_4_ <= 0.0),-(uint)(auVar110._0_4_ <= 0.0)) &
                       0x7fffffff7fffffff;
                  auVar71._8_4_ = -(uint)(auVar110._8_4_ <= 0.0) & 0x7fffffff;
                  auVar71._12_4_ = -(uint)(auVar110._12_4_ <= 0.0) & 0x7fffffff;
                  auVar76 = minps(auVar71 | auVar83,auVar68);
                  auVar76 = maxps(auVar76,auVar87);
                  fVar105 = auVar76._0_4_ * 1.442695 + 0.5;
                  fVar106 = auVar76._4_4_ * 1.442695 + 0.5;
                  fVar107 = auVar76._8_4_ * 1.442695 + 0.5;
                  fVar108 = auVar76._12_4_ * 1.442695 + 0.5;
                  fVar94 = (float)(int)fVar105;
                  fVar101 = (float)(int)fVar106;
                  fVar103 = (float)(int)fVar107;
                  fVar104 = (float)(int)fVar108;
                  fVar94 = fVar94 - (float)(-(uint)(fVar105 < fVar94) & (uint)fVar66);
                  fVar101 = fVar101 - (float)(-(uint)(fVar106 < fVar101) & (uint)auVar100._0_4_);
                  fVar103 = fVar103 - (float)(-(uint)(fVar107 < fVar103) & (uint)fVar69);
                  fVar104 = fVar104 - (float)(-(uint)(fVar108 < fVar104) & (uint)fVar109);
                  fVar105 = auVar76._0_4_ - fVar94 * 0.6931472;
                  fVar106 = auVar76._4_4_ - fVar101 * 0.6931472;
                  fVar107 = auVar76._8_4_ - fVar103 * 0.6931472;
                  fVar108 = auVar76._12_4_ - fVar104 * 0.6931472;
                  auVar72._0_4_ =
                       fVar105 + fVar66 +
                       (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) *
                          fVar105 + 0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5) *
                       fVar105 * fVar105;
                  auVar72._4_4_ =
                       fVar106 + auVar100._0_4_ +
                       (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) *
                          fVar106 + 0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5) *
                       fVar106 * fVar106;
                  auVar72._8_4_ =
                       fVar107 + fVar69 +
                       (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) *
                          fVar107 + 0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) *
                       fVar107 * fVar107;
                  auVar72._12_4_ =
                       fVar108 + fVar109 +
                       (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) *
                          fVar108 + 0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5) *
                       fVar108 * fVar108;
                  fVar94 = (float)((int)fVar94 * 0x800000 + (int)fVar66) * auVar72._0_4_ + fVar66;
                  fVar101 = (float)((int)fVar101 * 0x800000 + (int)auVar100._0_4_) * auVar72._4_4_ +
                            auVar100._0_4_;
                  fVar103 = (float)((int)fVar103 * 0x800000 + (int)fVar69) * auVar72._8_4_ + fVar69;
                  fVar109 = (float)((int)fVar104 * 0x800000 + (int)fVar109) * auVar72._12_4_ +
                            fVar109;
                  auVar76._4_4_ = fVar101;
                  auVar76._0_4_ = fVar94;
                  auVar76._8_4_ = fVar103;
                  auVar76._12_4_ = fVar109;
                  auVar76 = rcpps(auVar72,auVar76);
                  fVar105 = auVar76._0_4_;
                  fVar106 = auVar76._4_4_;
                  fVar107 = auVar76._8_4_;
                  fVar108 = auVar76._12_4_;
                  auVar89._0_4_ =
                       fVar70 * (fVar105 + fVar105 + -1.0 +
                                (2.0 - fVar94 * (fVar105 + fVar105)) * fVar105);
                  auVar89._4_4_ =
                       fVar95 * (fVar106 + fVar106 + -1.0 +
                                (2.0 - fVar101 * (fVar106 + fVar106)) * fVar106);
                  auVar89._8_4_ =
                       fVar82 * (fVar107 + fVar107 + -1.0 +
                                (2.0 - fVar103 * (fVar107 + fVar107)) * fVar107);
                  auVar89._12_4_ =
                       fVar102 * (fVar108 + fVar108 + -1.0 +
                                 (2.0 - fVar109 * (fVar108 + fVar108)) * fVar108);
                  break;
                case 6:
                  fVar109 = **(float **)(&this->field_0x118 + (long)p_Var38);
                  fVar105 = (*(float **)(&this->field_0x118 + (long)p_Var38))[1];
                  auVar75._0_4_ = fVar109 * fVar70 + fVar105;
                  auVar75._4_4_ = fVar109 * fVar95 + fVar105;
                  auVar75._8_4_ = fVar109 * fVar82 + fVar105;
                  auVar75._12_4_ = fVar109 * fVar102 + fVar105;
                  auVar76 = maxps(auVar75,auVar76);
                  auVar76 = minps(auVar76,auVar65);
                  auVar89._0_4_ = fVar70 * auVar76._0_4_;
                  auVar89._4_4_ = fVar95 * auVar76._4_4_;
                  auVar89._8_4_ = fVar82 * auVar76._8_4_;
                  auVar89._12_4_ = fVar102 * auVar76._12_4_;
                }
                *pauVar56 = auVar89;
                pauVar56 = pauVar56 + 1;
                uVar59 = uVar59 + 1;
                iVar35 = iVar35 + 1;
              } while (uVar59 != local_1a8.w);
            }
            local_278 = local_278 + 1;
          } while (local_278 != local_1a8.h);
        }
        local_268 = local_268 + 1;
      } while (local_268 != local_1a8.c);
    }
    auVar65 = _DAT_00565660;
    auVar87 = _DAT_00565630;
    auVar68 = _DAT_00565620;
    if ((int)local_138 == 1 && local_218 == 0) {
      if ((long)local_1a8.c < 1) goto LAB_00283f39;
      p_Var38 = pp_Var8[-3];
      iVar5 = *(int *)(&this->field_0xdc + (long)p_Var38);
      iVar6 = *(int *)(&this->field_0xe0 + (long)p_Var38);
      local_1f8._0_4_ = iVar6;
      iVar51 = *(int *)(&this->field_0xe4 + (long)p_Var38);
      iVar58 = *(int *)(&this->field_0xe8 + (long)p_Var38);
      uVar88 = *(undefined4 *)(&this->field_0x114 + (long)p_Var38);
      lVar60 = *(long *)(&this->field_0x1a8 + (long)p_Var38);
      uVar31 = *(uint *)(&this->field_0xd4 + (long)p_Var38);
      uVar43 = *(uint *)(&this->field_0xd8 + (long)p_Var38);
      local_268 = 0;
      fVar66 = (float)DAT_00565660;
      auVar100._0_4_ = DAT_00565660._4_4_;
      fVar69 = DAT_00565660._8_4_;
      do {
        if (0 < local_1a8.h) {
          iVar40 = bottom_blob->w;
          iVar48 = bottom_blob->h;
          pauVar56 = (undefined1 (*) [16])
                     (local_1a8.cstep * local_268 *
                      CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize) +
                     (long)local_1a8.data);
          uVar7 = bottom_blob->c;
          local_278 = 0;
          do {
            if (0 < local_1a8.w) {
              uVar59 = 0;
              iVar35 = (1 - uVar31) * iVar5;
              do {
                auVar76 = ZEXT816(0);
                if (lVar60 == 0) {
                  auVar91 = ZEXT816(0);
                }
                else {
                  auVar91 = *(undefined1 (*) [16])(lVar60 + local_268 * 0x10);
                }
                if (0 < (int)uVar7) {
                  pvVar62 = (void *)((this->weight_data_tm).cstep * local_268 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  lVar46 = (long)bottom_blob->w * bottom_blob->elemsize;
                  local_158._0_8_ = lVar46;
                  uVar45 = 0;
                  do {
                    if (0 < (int)uVar43) {
                      uVar52 = 0;
                      uVar63 = 0;
                      do {
                        iVar32 = (((int)uVar63 - uVar43) + 1) * iVar6 + local_278;
                        if (((-1 < iVar32) && (iVar33 = iVar32 / iVar58, iVar32 % iVar58 == 0)) &&
                           ((iVar33 < iVar48 && (0 < (int)uVar31)))) {
                          uVar53 = (ulong)uVar31;
                          uVar57 = uVar52;
                          auVar89 = auVar91;
                          iVar32 = iVar35;
                          do {
                            auVar91 = auVar89;
                            if (((-1 < iVar32) && (iVar34 = iVar32 / iVar51, iVar32 % iVar51 == 0))
                               && (iVar34 < iVar40)) {
                              fVar109 = *(float *)((long)bottom_blob->data +
                                                  (long)iVar34 * 4 +
                                                  iVar33 * lVar46 +
                                                  bottom_blob->cstep * bottom_blob->elemsize *
                                                  uVar45);
                              pfVar50 = (float *)((long)pvVar62 + (uVar57 & 0xffffffff) * 4);
                              auVar91._0_4_ = auVar89._0_4_ + fVar109 * *pfVar50;
                              auVar91._4_4_ = auVar89._4_4_ + fVar109 * pfVar50[1];
                              auVar91._8_4_ = auVar89._8_4_ + fVar109 * pfVar50[2];
                              auVar91._12_4_ = auVar89._12_4_ + fVar109 * pfVar50[3];
                            }
                            uVar57 = uVar57 + 4;
                            iVar32 = iVar32 + iVar5;
                            uVar53 = uVar53 - 1;
                            auVar89 = auVar91;
                          } while (uVar53 != 0);
                        }
                        uVar63 = uVar63 + 1;
                        uVar52 = uVar52 + (ulong)uVar31 * 4;
                      } while (uVar63 != uVar43);
                    }
                    pvVar62 = (void *)((long)pvVar62 + (long)(int)(uVar31 * uVar43 * 4) * 4);
                    uVar45 = uVar45 + 1;
                  } while (uVar45 != uVar7);
                }
                fVar70 = auVar91._0_4_;
                fVar95 = auVar91._4_4_;
                fVar82 = auVar91._8_4_;
                fVar102 = auVar91._12_4_;
                fVar109 = auVar65._12_4_;
                switch(uVar88) {
                case 1:
                  auVar91 = maxps(auVar91,auVar76);
                  break;
                case 2:
                  auVar89 = maxps(auVar91,auVar76);
                  auVar76 = minps(auVar91,auVar76);
                  fVar109 = **(float **)(&this->field_0x118 + (long)p_Var38);
                  auVar91._4_4_ = fVar109 * auVar76._4_4_ + auVar89._4_4_;
                  auVar91._0_4_ = fVar109 * auVar76._0_4_ + auVar89._0_4_;
                  auVar91._8_4_ = fVar109 * auVar76._8_4_ + auVar89._8_4_;
                  auVar91._12_4_ = fVar109 * auVar76._12_4_ + auVar89._12_4_;
                  break;
                case 3:
                  uVar3 = **(undefined4 **)(&this->field_0x118 + (long)p_Var38);
                  uVar4 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var38))[1];
                  auVar79._4_4_ = uVar3;
                  auVar79._0_4_ = uVar3;
                  auVar79._8_4_ = uVar3;
                  auVar79._12_4_ = uVar3;
                  auVar98._4_4_ = uVar4;
                  auVar98._0_4_ = uVar4;
                  auVar98._8_4_ = uVar4;
                  auVar98._12_4_ = uVar4;
                  auVar76 = maxps(auVar91,auVar79);
                  auVar91 = minps(auVar76,auVar98);
                  break;
                case 4:
                  auVar92._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
                  auVar92._8_4_ = -fVar82;
                  auVar92._12_4_ = -fVar102;
                  auVar76 = minps(auVar92,auVar68);
                  auVar76 = maxps(auVar76,auVar87);
                  fVar95 = auVar76._0_4_ * 1.442695 + 0.5;
                  fVar102 = auVar76._4_4_ * 1.442695 + 0.5;
                  fVar106 = auVar76._8_4_ * 1.442695 + 0.5;
                  fVar108 = auVar76._12_4_ * 1.442695 + 0.5;
                  fVar70 = (float)(int)fVar95;
                  fVar82 = (float)(int)fVar102;
                  fVar105 = (float)(int)fVar106;
                  fVar107 = (float)(int)fVar108;
                  fVar70 = fVar70 - (float)(-(uint)(fVar95 < fVar70) & (uint)fVar66);
                  fVar82 = fVar82 - (float)(-(uint)(fVar102 < fVar82) & (uint)auVar100._0_4_);
                  fVar105 = fVar105 - (float)(-(uint)(fVar106 < fVar105) & (uint)fVar69);
                  fVar107 = fVar107 - (float)(-(uint)(fVar108 < fVar107) & (uint)fVar109);
                  fVar95 = fVar70 * -0.6931472 + auVar76._0_4_;
                  fVar102 = fVar82 * -0.6931472 + auVar76._4_4_;
                  fVar106 = fVar105 * -0.6931472 + auVar76._8_4_;
                  fVar108 = fVar107 * -0.6931472 + auVar76._12_4_;
                  auVar80._0_4_ =
                       fVar95 + fVar66 +
                       (((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 + 0.008333452) * fVar95
                         + 0.041665796) * fVar95 + 0.16666666) * fVar95 + 0.5) * fVar95 * fVar95;
                  auVar80._4_4_ =
                       fVar102 + auVar100._0_4_ +
                       (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) *
                          fVar102 + 0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5) *
                       fVar102 * fVar102;
                  auVar80._8_4_ =
                       fVar106 + fVar69 +
                       (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) *
                          fVar106 + 0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5) *
                       fVar106 * fVar106;
                  auVar80._12_4_ =
                       fVar108 + fVar109 +
                       (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) *
                          fVar108 + 0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5) *
                       fVar108 * fVar108;
                  auVar99._0_4_ =
                       (float)((int)fVar70 * 0x800000 + (int)fVar66) * auVar80._0_4_ + fVar66;
                  auVar99._4_4_ =
                       (float)((int)fVar82 * 0x800000 + (int)auVar100._0_4_) * auVar80._4_4_ +
                       auVar100._0_4_;
                  auVar99._8_4_ =
                       (float)((int)fVar105 * 0x800000 + (int)fVar69) * auVar80._8_4_ + fVar69;
                  auVar99._12_4_ =
                       (float)((int)fVar107 * 0x800000 + (int)fVar109) * auVar80._12_4_ + fVar109;
                  auVar76 = rcpps(auVar80,auVar99);
                  fVar70 = auVar76._0_4_;
                  fVar95 = auVar76._4_4_;
                  fVar82 = auVar76._8_4_;
                  fVar102 = auVar76._12_4_;
                  auVar91._0_4_ = (fVar66 - auVar99._0_4_ * fVar70) * fVar70 + fVar70;
                  auVar91._4_4_ = (auVar100._0_4_ - auVar99._4_4_ * fVar95) * fVar95 + fVar95;
                  auVar91._8_4_ = (fVar69 - auVar99._8_4_ * fVar82) * fVar82 + fVar82;
                  auVar91._12_4_ = (fVar109 - auVar99._12_4_ * fVar102) * fVar102 + fVar102;
                  break;
                case 5:
                  auVar76 = minps(auVar91,auVar68);
                  auVar76 = maxps(auVar76,auVar87);
                  fVar105 = auVar76._0_4_ * 1.442695 + 0.5;
                  fVar106 = auVar76._4_4_ * 1.442695 + 0.5;
                  fVar107 = auVar76._8_4_ * 1.442695 + 0.5;
                  fVar108 = auVar76._12_4_ * 1.442695 + 0.5;
                  fVar94 = (float)(int)fVar105;
                  fVar101 = (float)(int)fVar106;
                  fVar103 = (float)(int)fVar107;
                  fVar104 = (float)(int)fVar108;
                  fVar94 = fVar94 - (float)(-(uint)(fVar105 < fVar94) & (uint)fVar66);
                  fVar101 = fVar101 - (float)(-(uint)(fVar106 < fVar101) & (uint)auVar100._0_4_);
                  fVar103 = fVar103 - (float)(-(uint)(fVar107 < fVar103) & (uint)fVar69);
                  fVar104 = fVar104 - (float)(-(uint)(fVar108 < fVar104) & (uint)fVar109);
                  fVar105 = auVar76._0_4_ - fVar94 * 0.6931472;
                  fVar106 = auVar76._4_4_ - fVar101 * 0.6931472;
                  fVar107 = auVar76._8_4_ - fVar103 * 0.6931472;
                  fVar108 = auVar76._12_4_ - fVar104 * 0.6931472;
                  auVar111._0_4_ =
                       (float)((int)fVar94 * 0x800000 + (int)fVar66) *
                       (fVar105 + fVar66 +
                       (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) *
                          fVar105 + 0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5) *
                       fVar105 * fVar105) + fVar66;
                  auVar111._4_4_ =
                       (float)((int)fVar101 * 0x800000 + (int)auVar100._0_4_) *
                       (fVar106 + auVar100._0_4_ +
                       (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) *
                          fVar106 + 0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5) *
                       fVar106 * fVar106) + auVar100._0_4_;
                  auVar111._8_4_ =
                       (float)((int)fVar103 * 0x800000 + (int)fVar69) *
                       (fVar107 + fVar69 +
                       (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) *
                          fVar107 + 0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) *
                       fVar107 * fVar107) + fVar69;
                  auVar111._12_4_ =
                       (float)((int)fVar104 * 0x800000 + (int)fVar109) *
                       (fVar108 + fVar109 +
                       (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) *
                          fVar108 + 0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5) *
                       fVar108 * fVar108) + fVar109;
                  auVar76 = maxps(auVar111,_DAT_005656d0);
                  fVar105 = (float)(auVar76._0_4_ & 0x807fffff | 0x3f000000);
                  fVar107 = (float)(auVar76._4_4_ & 0x807fffff | 0x3f000000);
                  fVar94 = (float)(auVar76._8_4_ & 0x807fffff | 0x3f000000);
                  fVar103 = (float)(auVar76._12_4_ & 0x807fffff | 0x3f000000);
                  fVar106 = fVar105 + -1.0 + (float)(-(uint)(fVar105 < 0.70710677) & (uint)fVar105);
                  fVar108 = fVar107 + -1.0 + (float)(-(uint)(fVar107 < 0.70710677) & (uint)fVar107);
                  fVar101 = fVar94 + -1.0 + (float)(-(uint)(fVar94 < 0.70710677) & (uint)fVar94);
                  fVar104 = fVar103 + -1.0 + (float)(-(uint)(fVar103 < 0.70710677) & (uint)fVar103);
                  auVar84._0_4_ =
                       ~-(uint)(auVar111._0_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar76._0_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar105 < 0.70710677) & (uint)fVar66)) * 0.6931472 +
                               fVar106 +
                              (((((((((fVar106 * 0.070376836 + -0.1151461) * fVar106 + 0.116769984)
                                     * fVar106 + -0.12420141) * fVar106 + 0.14249323) * fVar106 +
                                  -0.16668057) * fVar106 + 0.20000714) * fVar106 + -0.24999994) *
                                fVar106 + 0.3333333) * fVar106 + -0.5) * fVar106 * fVar106) * -2.0);
                  auVar84._4_4_ =
                       ~-(uint)(auVar111._4_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar76._4_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar107 < 0.70710677) & (uint)auVar100._0_4_)) *
                               0.6931472 + fVar108 +
                              (((((((((fVar108 * 0.070376836 + -0.1151461) * fVar108 + 0.116769984)
                                     * fVar108 + -0.12420141) * fVar108 + 0.14249323) * fVar108 +
                                  -0.16668057) * fVar108 + 0.20000714) * fVar108 + -0.24999994) *
                                fVar108 + 0.3333333) * fVar108 + -0.5) * fVar108 * fVar108) * -2.0);
                  auVar84._8_4_ =
                       ~-(uint)(auVar111._8_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar76._8_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar94 < 0.70710677) & (uint)fVar69)) * 0.6931472 +
                               fVar101 +
                              (((((((((fVar101 * 0.070376836 + -0.1151461) * fVar101 + 0.116769984)
                                     * fVar101 + -0.12420141) * fVar101 + 0.14249323) * fVar101 +
                                  -0.16668057) * fVar101 + 0.20000714) * fVar101 + -0.24999994) *
                                fVar101 + 0.3333333) * fVar101 + -0.5) * fVar101 * fVar101) * -2.0);
                  auVar84._12_4_ =
                       ~-(uint)(auVar111._12_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar76._12_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar103 < 0.70710677) & (uint)fVar109)) * 0.6931472 +
                               fVar104 +
                              (((((((((fVar104 * 0.070376836 + -0.1151461) * fVar104 + 0.116769984)
                                     * fVar104 + -0.12420141) * fVar104 + 0.14249323) * fVar104 +
                                  -0.16668057) * fVar104 + 0.20000714) * fVar104 + -0.24999994) *
                                fVar104 + 0.3333333) * fVar104 + -0.5) * fVar104 * fVar104) * -2.0);
                  auVar77._0_8_ =
                       CONCAT44(-(uint)(auVar111._4_4_ <= 0.0),-(uint)(auVar111._0_4_ <= 0.0)) &
                       0x7fffffff7fffffff;
                  auVar77._8_4_ = -(uint)(auVar111._8_4_ <= 0.0) & 0x7fffffff;
                  auVar77._12_4_ = -(uint)(auVar111._12_4_ <= 0.0) & 0x7fffffff;
                  auVar76 = minps(auVar77 | auVar84,auVar68);
                  auVar76 = maxps(auVar76,auVar87);
                  fVar105 = auVar76._0_4_ * 1.442695 + 0.5;
                  fVar106 = auVar76._4_4_ * 1.442695 + 0.5;
                  fVar107 = auVar76._8_4_ * 1.442695 + 0.5;
                  fVar108 = auVar76._12_4_ * 1.442695 + 0.5;
                  fVar94 = (float)(int)fVar105;
                  fVar101 = (float)(int)fVar106;
                  fVar103 = (float)(int)fVar107;
                  fVar104 = (float)(int)fVar108;
                  fVar94 = fVar94 - (float)(-(uint)(fVar105 < fVar94) & (uint)fVar66);
                  fVar101 = fVar101 - (float)(-(uint)(fVar106 < fVar101) & (uint)auVar100._0_4_);
                  fVar103 = fVar103 - (float)(-(uint)(fVar107 < fVar103) & (uint)fVar69);
                  fVar104 = fVar104 - (float)(-(uint)(fVar108 < fVar104) & (uint)fVar109);
                  fVar105 = auVar76._0_4_ - fVar94 * 0.6931472;
                  fVar106 = auVar76._4_4_ - fVar101 * 0.6931472;
                  fVar107 = auVar76._8_4_ - fVar103 * 0.6931472;
                  fVar108 = auVar76._12_4_ - fVar104 * 0.6931472;
                  auVar78._0_4_ =
                       fVar105 + fVar66 +
                       (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) *
                          fVar105 + 0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5) *
                       fVar105 * fVar105;
                  auVar78._4_4_ =
                       fVar106 + auVar100._0_4_ +
                       (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) *
                          fVar106 + 0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5) *
                       fVar106 * fVar106;
                  auVar78._8_4_ =
                       fVar107 + fVar69 +
                       (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) *
                          fVar107 + 0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) *
                       fVar107 * fVar107;
                  auVar78._12_4_ =
                       fVar108 + fVar109 +
                       (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) *
                          fVar108 + 0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5) *
                       fVar108 * fVar108;
                  fVar94 = (float)((int)fVar94 * 0x800000 + (int)fVar66) * auVar78._0_4_ + fVar66;
                  fVar101 = (float)((int)fVar101 * 0x800000 + (int)auVar100._0_4_) * auVar78._4_4_ +
                            auVar100._0_4_;
                  fVar103 = (float)((int)fVar103 * 0x800000 + (int)fVar69) * auVar78._8_4_ + fVar69;
                  fVar109 = (float)((int)fVar104 * 0x800000 + (int)fVar109) * auVar78._12_4_ +
                            fVar109;
                  auVar19._4_4_ = fVar101;
                  auVar19._0_4_ = fVar94;
                  auVar19._8_4_ = fVar103;
                  auVar19._12_4_ = fVar109;
                  auVar76 = rcpps(auVar78,auVar19);
                  fVar105 = auVar76._0_4_;
                  fVar106 = auVar76._4_4_;
                  fVar107 = auVar76._8_4_;
                  fVar108 = auVar76._12_4_;
                  auVar91._0_4_ =
                       fVar70 * (fVar105 + fVar105 + -1.0 +
                                (2.0 - fVar94 * (fVar105 + fVar105)) * fVar105);
                  auVar91._4_4_ =
                       fVar95 * (fVar106 + fVar106 + -1.0 +
                                (2.0 - fVar101 * (fVar106 + fVar106)) * fVar106);
                  auVar91._8_4_ =
                       fVar82 * (fVar107 + fVar107 + -1.0 +
                                (2.0 - fVar103 * (fVar107 + fVar107)) * fVar107);
                  auVar91._12_4_ =
                       fVar102 * (fVar108 + fVar108 + -1.0 +
                                 (2.0 - fVar109 * (fVar108 + fVar108)) * fVar108);
                  break;
                case 6:
                  fVar109 = **(float **)(&this->field_0x118 + (long)p_Var38);
                  fVar105 = (*(float **)(&this->field_0x118 + (long)p_Var38))[1];
                  auVar81._0_4_ = fVar109 * fVar70 + fVar105;
                  auVar81._4_4_ = fVar109 * fVar95 + fVar105;
                  auVar81._8_4_ = fVar109 * fVar82 + fVar105;
                  auVar81._12_4_ = fVar109 * fVar102 + fVar105;
                  auVar76 = maxps(auVar81,auVar76);
                  auVar76 = minps(auVar76,auVar65);
                  auVar91._0_4_ = fVar70 * auVar76._0_4_;
                  auVar91._4_4_ = fVar95 * auVar76._4_4_;
                  auVar91._8_4_ = fVar82 * auVar76._8_4_;
                  auVar91._12_4_ = fVar102 * auVar76._12_4_;
                }
                *pauVar56 = auVar91;
                pauVar56 = pauVar56 + 1;
                uVar59 = uVar59 + 1;
                iVar35 = iVar35 + 1;
              } while (uVar59 != local_1a8.w);
            }
            local_278 = local_278 + 1;
          } while (local_278 != local_1a8.h);
        }
        local_268 = local_268 + 1;
      } while (local_268 != local_1a8.c);
    }
    if (((int)local_138 == 4) && (local_218 != 0)) {
      local_130 = (long)local_1a8.c;
      if (0 < local_130) {
        p_Var38 = pp_Var8[-3];
        iVar5 = *(int *)(&this->field_0xdc + (long)p_Var38);
        iVar6 = *(int *)(&this->field_0xe0 + (long)p_Var38);
        iVar41 = *(int *)(&this->field_0xe4 + (long)p_Var38);
        iVar49 = *(int *)(&this->field_0xe8 + (long)p_Var38);
        uVar88 = *(undefined4 *)(&this->field_0x114 + (long)p_Var38);
        lVar60 = *(long *)(&this->field_0x1a8 + (long)p_Var38);
        uVar31 = *(uint *)(&this->field_0xd4 + (long)p_Var38);
        uVar43 = *(uint *)(&this->field_0xd8 + (long)p_Var38);
        lVar46 = CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize) * local_1a8.cstep
        ;
        iVar51 = bottom_blob->w;
        iVar58 = bottom_blob->h;
        uVar7 = bottom_blob->c;
        local_268 = 0;
        do {
          if (0 < iVar44) {
            sVar10 = (this->weight_data_tm).cstep;
            sVar11 = (this->weight_data_tm).elemsize;
            local_220 = (float *)(lVar46 * local_268 + (long)pvVar29);
            pvVar62 = (this->weight_data_tm).data;
            iVar40 = 0;
            do {
              if (0 < iVar42) {
                iVar35 = bottom_blob->w;
                pvVar9 = bottom_blob->data;
                sVar12 = bottom_blob->elemsize;
                sVar13 = bottom_blob->cstep;
                pfVar50 = *(float **)(&this->field_0x118 + (long)p_Var38);
                uVar59 = 0;
                iVar48 = (1 - uVar31) * iVar5;
                do {
                  if (lVar60 == 0) {
                    fVar66 = 0.0;
                  }
                  else {
                    fVar66 = *(float *)(lVar60 + local_268 * 4);
                  }
                  if ((int)uVar7 < 1) {
                    auVar67 = ZEXT816(0);
                  }
                  else {
                    auVar67 = ZEXT816(0);
                    uVar45 = 0;
                    pvVar54 = (void *)(sVar10 * local_268 * sVar11 + (long)pvVar62);
                    do {
                      local_158._0_8_ = uVar45;
                      if (0 < (int)uVar43) {
                        uVar52 = 0;
                        uVar63 = 0;
                        do {
                          iVar32 = (((int)uVar63 - uVar43) + 1) * iVar6 + iVar40;
                          if (((-1 < iVar32) && (iVar33 = iVar32 / iVar49, iVar32 % iVar49 == 0)) &&
                             ((0 < (int)uVar31 && (iVar33 < iVar58)))) {
                            uVar53 = (ulong)uVar31;
                            uVar57 = uVar52;
                            auVar68 = auVar67;
                            iVar32 = iVar48;
                            do {
                              auVar67 = auVar68;
                              if (((-1 < iVar32) && (iVar34 = iVar32 / iVar41, iVar32 % iVar41 == 0)
                                  ) && (iVar34 < iVar51)) {
                                pfVar55 = (float *)((long)pvVar54 + (uVar57 & 0xffffffff) * 4);
                                pfVar1 = (float *)((long)pvVar9 +
                                                  (long)(iVar34 << 2) * 4 +
                                                  (long)iVar33 * (long)iVar35 * sVar12 +
                                                  sVar13 * sVar12 * uVar45);
                                auVar67._0_4_ = auVar68._0_4_ + *pfVar55 * *pfVar1;
                                auVar67._4_4_ = auVar68._4_4_ + pfVar55[1] * pfVar1[1];
                                auVar67._8_4_ = auVar68._8_4_ + pfVar55[2] * pfVar1[2];
                                auVar67._12_4_ = auVar68._12_4_ + pfVar55[3] * pfVar1[3];
                              }
                              uVar57 = uVar57 + 4;
                              iVar32 = iVar32 + iVar5;
                              uVar53 = uVar53 - 1;
                              auVar68 = auVar67;
                            } while (uVar53 != 0);
                          }
                          uVar63 = uVar63 + 1;
                          uVar52 = uVar52 + (ulong)uVar31 * 4;
                        } while (uVar63 != uVar43);
                      }
                      pvVar54 = (void *)((long)pvVar54 + (long)(int)(uVar31 * uVar43 * 4) * 4);
                      uVar45 = uVar45 + 1;
                    } while (uVar45 != uVar7);
                  }
                  auVar86._4_4_ = auVar67._12_4_ + auVar67._4_4_;
                  auVar86._0_4_ = auVar86._4_4_;
                  auVar86._8_4_ = auVar86._4_4_;
                  auVar86._12_4_ = auVar86._4_4_;
                  auVar100._4_12_ = auVar86._4_12_;
                  auVar100._0_4_ = auVar86._4_4_ + fVar66 + auVar67._8_4_ + auVar67._0_4_;
                  fVar66 = auVar100._0_4_;
                  switch(uVar88) {
                  case 1:
                    if (auVar100._0_4_ <= 0.0) {
                      auVar20._12_4_ = 0;
                      auVar20._0_12_ = auVar100._4_12_;
                      auVar100 = auVar20 << 0x20;
                    }
LAB_00283507:
                    fVar66 = auVar100._0_4_;
                    break;
                  case 2:
                    fVar66 = (float)(~-(uint)(0.0 < auVar100._0_4_) & (uint)*pfVar50 |
                                    -(uint)(0.0 < auVar100._0_4_) & 0x3f800000) * auVar100._0_4_;
                    break;
                  case 3:
                    if (auVar100._0_4_ <= *pfVar50) {
                      auVar100._0_4_ = *pfVar50;
                    }
                    fVar66 = auVar100._0_4_;
                    if (pfVar50[1] < auVar100._0_4_) {
                      fVar66 = pfVar50[1];
                    }
                    break;
                  case 4:
                    if (88.37626 <= auVar100._0_4_) {
                      auVar100._0_4_ = 88.37626;
                    }
                    fVar66 = expf((float)(-(uint)(auVar100._0_4_ < -88.37626) & 0x42b0c0a5 |
                                         ~-(uint)(auVar100._0_4_ < -88.37626) &
                                         (uint)-auVar100._0_4_));
                    fVar66 = 1.0 / (fVar66 + 1.0);
                    break;
                  case 5:
                    local_158 = auVar100;
                    fVar66 = expf(auVar100._0_4_);
                    fVar66 = logf(fVar66 + 1.0);
                    fVar66 = tanhf(fVar66);
                    fVar66 = fVar66 * (float)local_158._0_4_;
                    break;
                  case 6:
                    fVar69 = *pfVar50;
                    fVar109 = -pfVar50[1] / fVar69;
                    fVar66 = 0.0;
                    if (fVar109 <= auVar100._0_4_) {
                      if (fVar109 + 1.0 / fVar69 < auVar100._0_4_) goto LAB_00283507;
                      fVar66 = (fVar69 * auVar100._0_4_ + pfVar50[1]) * auVar100._0_4_;
                    }
                  }
                  *local_220 = fVar66;
                  local_220 = local_220 + 1;
                  uVar59 = uVar59 + 1;
                  iVar48 = iVar48 + 1;
                } while (uVar59 != iVar42);
              }
              iVar40 = iVar40 + 1;
            } while (iVar40 != iVar44);
          }
          local_268 = local_268 + 1;
        } while (local_268 != local_130);
      }
    }
    else if (local_218 == 1 && (int)local_138 == 1) {
      pp_Var8 = this->_vptr_Deconvolution_x86;
      p_Var38 = pp_Var8[-3];
      if (0 < *(int *)(&this->field_0xd0 + (long)p_Var38)) {
        lVar60 = local_1a8.cstep * CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize)
        ;
        iVar5 = bottom_blob->w;
        iVar6 = bottom_blob->h;
        uVar31 = bottom_blob->c;
        uVar45 = (ulong)(uint)local_1a8.w;
        lVar46 = (long)local_1a8.w;
        local_158._0_8_ = (long)iVar49 << 2;
        local_240 = 0;
        do {
          if (0 < iVar44) {
            local_280 = (void *)(lVar60 * local_240 + (long)pvVar29);
            pp_Var15 = this->_vptr_Deconvolution_x86;
            sVar10 = (this->weight_data_tm).cstep;
            sVar11 = (this->weight_data_tm).elemsize;
            pvVar62 = (this->weight_data_tm).data;
            iVar49 = 0;
            do {
              if (0 < iVar42) {
                iVar58 = bottom_blob->w;
                pvVar9 = bottom_blob->data;
                sVar12 = bottom_blob->elemsize;
                sVar13 = bottom_blob->cstep;
                pp_Var16 = this->_vptr_Deconvolution_x86;
                iVar40 = iVar49 - (int)local_130;
                uVar63 = 0;
                iVar51 = -iVar41;
                do {
                  p_Var38 = pp_Var15[-3];
                  if (*(int *)(&this->field_0x10c + (long)p_Var38) == 0) {
                    auVar85 = ZEXT812(0);
                  }
                  else {
                    auVar85._4_8_ = 0;
                    auVar85._0_4_ =
                         *(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var38) + local_240 * 4);
                  }
                  auVar87._12_4_ = 0;
                  auVar87._0_12_ = auVar85;
                  if (0 < (int)uVar31) {
                    p_Var17 = pp_Var16[-3];
                    local_1f8._0_8_ = (void *)(sVar10 * sVar11 * local_240 + (long)pvVar62);
                    uVar52 = 0;
                    do {
                      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var17)) {
                        iVar48 = 0;
                        do {
                          iVar35 = *(int *)(&this->field_0xe0 + (long)p_Var17) * iVar48 + iVar40;
                          if (((-1 < iVar35) &&
                              (iVar32 = iVar35 / *(int *)(&this->field_0xe8 + (long)p_Var17),
                              iVar35 % *(int *)(&this->field_0xe8 + (long)p_Var17) == 0)) &&
                             (iVar32 < iVar6)) {
                            iVar35 = *(int *)(&this->field_0xd4 + (long)p_Var17);
                            if (0 < (long)iVar35) {
                              lVar61 = 0;
                              iVar33 = iVar51;
                              do {
                                if (((-1 < iVar33) &&
                                    (iVar34 = iVar33 / *(int *)(&this->field_0xe4 + (long)p_Var17),
                                    iVar33 % *(int *)(&this->field_0xe4 + (long)p_Var17) == 0)) &&
                                   (iVar34 < iVar5)) {
                                  auVar87._0_4_ =
                                       auVar87._0_4_ +
                                       *(float *)(local_1f8._0_8_ +
                                                  (ulong)(uint)(iVar35 * iVar48) * 4 + lVar61 * 4) *
                                       *(float *)((long)pvVar9 +
                                                 (long)iVar34 * 4 +
                                                 (long)iVar32 * (long)iVar58 * sVar12 +
                                                 sVar13 * sVar12 * uVar52);
                                }
                                lVar61 = lVar61 + 1;
                                iVar33 = iVar33 + *(int *)(&this->field_0xdc + (long)p_Var17);
                              } while (iVar35 != lVar61);
                            }
                          }
                          iVar48 = iVar48 + 1;
                        } while (iVar48 != *(int *)(&this->field_0xd8 + (long)p_Var17));
                      }
                      uVar52 = uVar52 + 1;
                      local_1f8._0_8_ = local_1f8._0_8_ + local_158._0_8_;
                    } while (uVar52 != uVar31);
                  }
                  fVar66 = auVar87._0_4_;
                  auVar65 = auVar87;
                  switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var38)) {
                  case 1:
                    if (fVar66 <= 0.0) {
                      auVar21._12_4_ = 0;
                      auVar21._0_12_ = auVar87._4_12_;
                      auVar65 = auVar21 << 0x20;
                    }
                    break;
                  case 2:
                    auVar65 = ZEXT416((uint)((float)(-(uint)(0.0 < fVar66) & 0x3f800000 |
                                                    ~-(uint)(0.0 < fVar66) &
                                                    **(uint **)(&this->field_0x118 + (long)p_Var38))
                                            * fVar66));
                    break;
                  case 3:
                    auVar100._0_4_ = **(float **)(&this->field_0x118 + (long)p_Var38);
                    if (fVar66 <= auVar100._0_4_) {
                      auVar87._0_4_ = auVar100._0_4_;
                    }
                    fVar66 = (*(float **)(&this->field_0x118 + (long)p_Var38))[1];
                    auVar65 = auVar87;
                    if (fVar66 < auVar87._0_4_) {
LAB_00283e67:
                      auVar65 = ZEXT416((uint)fVar66);
                    }
                    break;
                  case 4:
                    if (88.37626 <= fVar66) {
                      fVar66 = 88.37626;
                    }
                    fVar66 = expf((float)(-(uint)(fVar66 < -88.37626) & 0x42b0c0a5 |
                                         ~-(uint)(fVar66 < -88.37626) & (uint)-fVar66));
                    auVar65 = ZEXT416((uint)(1.0 / (fVar66 + 1.0)));
                    break;
                  case 5:
                    auVar100._0_4_ = expf(fVar66);
                    auVar100._0_4_ = logf(auVar100._0_4_ + 1.0);
                    auVar100._0_4_ = tanhf(auVar100._0_4_);
                    auVar65._0_4_ = auVar100._0_4_ * fVar66;
                    auVar65._4_12_ = extraout_var;
                    local_1f8 = auVar87;
                    break;
                  case 6:
                    auVar100._0_4_ = **(float **)(&this->field_0x118 + (long)p_Var38);
                    fVar69 = (*(float **)(&this->field_0x118 + (long)p_Var38))[1];
                    fVar109 = -fVar69 / auVar100._0_4_;
                    auVar65 = ZEXT816(0);
                    if ((fVar109 <= fVar66) &&
                       (auVar65 = auVar87, fVar66 <= fVar109 + 1.0 / auVar100._0_4_)) {
                      fVar66 = (auVar100._0_4_ * fVar66 + fVar69) * fVar66;
                      goto LAB_00283e67;
                    }
                  }
                  *(int *)((long)local_280 + uVar63 * 4) = auVar65._0_4_;
                  uVar63 = uVar63 + 1;
                  iVar51 = iVar51 + 1;
                } while (uVar63 != uVar45);
              }
              local_280 = (void *)((long)local_280 + lVar46 * 4);
              iVar49 = iVar49 + 1;
            } while (iVar49 != iVar44);
            p_Var38 = pp_Var8[-3];
          }
          local_240 = local_240 + 1;
        } while (local_240 < *(int *)(&this->field_0xd0 + (long)p_Var38));
      }
    }
  }
LAB_00283f39:
  pMVar30 = local_128;
  Deconvolution::cut_padding
            ((Deconvolution *)
             ((long)&this->_vptr_Deconvolution_x86 + (long)this->_vptr_Deconvolution_x86[-3]),
             &local_1a8,local_128,local_140);
  if ((pMVar30->data == (void *)0x0) || (iVar49 = 0, (long)pMVar30->c * pMVar30->cstep == 0)) {
    iVar49 = -100;
  }
LAB_00283f80:
  piVar18 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        if (local_1a8.data != (void *)0x0) {
          free(local_1a8.data);
        }
      }
      else {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar49;
}

Assistant:

int Deconvolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        gemm->forward(bottom_blob_2, top_col2im, opt_b);

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_load_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_load_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_load_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}